

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileReceiveSession.cpp
# Opt level: O0

void __thiscall FileReceiveSession::FileReceiveSession(FileReceiveSession *this,path *file)

{
  allocator<char> local_39;
  string local_38;
  path *local_18;
  path *file_local;
  FileReceiveSession *this_local;
  
  local_18 = file;
  file_local = (path *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"FileReceiveSession",&local_39);
  Subscriber::Subscriber(&this->super_Subscriber,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_001edbb0;
  boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream(&this->stream);
  boost::filesystem::path::path(&this->file,local_18);
  std::function<void_(boost::filesystem::path)>::function(&this->success);
  std::function<void_(boost::filesystem::path)>::function(&this->fail);
  Subscriber::set_expected(&this->super_Subscriber,1);
  boost::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
            (&this->stream,(char *)local_18,0x10);
  return;
}

Assistant:

FileReceiveSession::FileReceiveSession(const fs::path &file) :
    Subscriber("FileReceiveSession"), stream(), file(file) {
  set_expected(POLLIN);
  stream.open(file, std::ios::out);
}